

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgscon.c
# Opt level: O0

void zgscon(char *norm,SuperMatrix *L,SuperMatrix *U,double anorm,double *rcond,SuperLUStat_t *stat,
           int *info)

{
  int iVar1;
  bool local_17d;
  int_t local_17c;
  char local_178 [4];
  int nrow;
  char msg [256];
  int local_70;
  int local_6c;
  int ii;
  int isave [3];
  doublecomplex *work;
  double ainvnm;
  int local_48;
  int onenrm;
  int kase1;
  int kase;
  int *info_local;
  SuperLUStat_t *stat_local;
  double *rcond_local;
  double anorm_local;
  SuperMatrix *U_local;
  SuperMatrix *L_local;
  char *norm_local;
  
  *info = 0;
  local_17d = true;
  _kase1 = info;
  info_local = (int *)stat;
  stat_local = (SuperLUStat_t *)rcond;
  rcond_local = (double *)anorm;
  anorm_local = (double)U;
  U_local = L;
  L_local = (SuperMatrix *)norm;
  if (*norm != '1') {
    iVar1 = strncmp(norm,"O",1);
    local_17d = iVar1 == 0;
  }
  ainvnm._4_4_ = (uint)local_17d;
  if ((ainvnm._4_4_ == 0) && (iVar1 = strncmp((char *)L_local,"I",1), iVar1 != 0)) {
    *_kase1 = -1;
  }
  else if ((((U_local->nrow < 0) || (U_local->nrow != U_local->ncol)) || (U_local->Stype != SLU_SC))
          || ((U_local->Dtype != SLU_Z || (U_local->Mtype != SLU_TRLU)))) {
    *_kase1 = -2;
  }
  else if (((*(int *)((long)anorm_local + 0xc) < 0) ||
           (*(int *)((long)anorm_local + 0xc) != *(int *)((long)anorm_local + 0x10))) ||
          ((*(int *)anorm_local != 0 ||
           ((*(int *)((long)anorm_local + 4) != 3 || (*(int *)((long)anorm_local + 8) != 4)))))) {
    *_kase1 = -3;
  }
  if (*_kase1 == 0) {
    stat_local->panel_histo = (int *)0x0;
    if ((U_local->nrow == 0) || (*(int *)((long)anorm_local + 0xc) == 0)) {
      stat_local->panel_histo = (int *)0x3ff0000000000000;
    }
    else {
      isave._4_8_ = doublecomplexCalloc((long)(U_local->nrow * 3));
      if ((doublecomplex *)isave._4_8_ == (doublecomplex *)0x0) {
        sprintf(local_178,"%s at line %d in file %s\n","Malloc fails for work arrays in zgscon.",
                0x7f,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgscon.c")
        ;
        superlu_abort_and_exit(local_178);
      }
      work = (doublecomplex *)0x0;
      if (ainvnm._4_4_ == 0) {
        local_48 = 2;
      }
      else {
        local_48 = 1;
      }
      onenrm = 0;
      local_17c = U_local->nrow;
      do {
        zlacon2_(&local_17c,(doublecomplex *)(isave._4_8_ + (long)U_local->nrow * 0x10),
                 (doublecomplex *)isave._4_8_,(double *)&work,&onenrm,&local_6c);
        if (onenrm == 0) break;
        if (onenrm == local_48) {
          sp_ztrsv("L","No trans","Unit",U_local,(SuperMatrix *)anorm_local,
                   (doublecomplex *)isave._4_8_,(SuperLUStat_t *)info_local,_kase1);
          sp_ztrsv("U","No trans","Non-unit",U_local,(SuperMatrix *)anorm_local,
                   (doublecomplex *)isave._4_8_,(SuperLUStat_t *)info_local,_kase1);
        }
        else {
          sp_ztrsv("U","Transpose","Non-unit",U_local,(SuperMatrix *)anorm_local,
                   (doublecomplex *)isave._4_8_,(SuperLUStat_t *)info_local,_kase1);
          sp_ztrsv("L","Transpose","Unit",U_local,(SuperMatrix *)anorm_local,
                   (doublecomplex *)isave._4_8_,(SuperLUStat_t *)info_local,_kase1);
        }
      } while (onenrm != 0);
      if (((double)work != 0.0) || (NAN((double)work))) {
        stat_local->panel_histo = (int *)((1.0 / (double)work) / (double)rcond_local);
      }
      superlu_free((void *)isave._4_8_);
    }
  }
  else {
    local_70 = -*_kase1;
    input_error("zgscon",&local_70);
  }
  return;
}

Assistant:

void
zgscon(char *norm, SuperMatrix *L, SuperMatrix *U,
       double anorm, double *rcond, SuperLUStat_t *stat, int *info)
{


    /* Local variables */
    int    kase, kase1, onenrm;
    double ainvnm;
    doublecomplex *work;
    int    isave[3];
    extern int zrscl_(int *, doublecomplex *, doublecomplex *, int *);

    extern int zlacon2_(int *, doublecomplex *, doublecomplex *, double *, int *, int []);

    
    /* Test the input parameters. */
    *info = 0;
    onenrm = *(unsigned char *)norm == '1' || strncmp(norm, "O", 1)==0;
    if (! onenrm && strncmp(norm, "I", 1)!=0) *info = -1;
    else if (L->nrow < 0 || L->nrow != L->ncol ||
             L->Stype != SLU_SC || L->Dtype != SLU_Z || L->Mtype != SLU_TRLU)
	 *info = -2;
    else if (U->nrow < 0 || U->nrow != U->ncol ||
             U->Stype != SLU_NC || U->Dtype != SLU_Z || U->Mtype != SLU_TRU) 
	*info = -3;
    if (*info != 0) {
	int ii = -(*info);
	input_error("zgscon", &ii);
	return;
    }

    /* Quick return if possible */
    *rcond = 0.;
    if ( L->nrow == 0 || U->nrow == 0) {
	*rcond = 1.;
	return;
    }

    work = doublecomplexCalloc( 3*L->nrow );


    if ( !work )
	ABORT("Malloc fails for work arrays in zgscon.");
    
    /* Estimate the norm of inv(A). */
    ainvnm = 0.;
    if ( onenrm ) kase1 = 1;
    else kase1 = 2;
    kase = 0;

    int nrow = L->nrow;

    do {
	zlacon2_(&nrow, &work[L->nrow], &work[0], &ainvnm, &kase, isave);

	if (kase == 0) break;

	if (kase == kase1) {
	    /* Multiply by inv(L). */
	    sp_ztrsv("L", "No trans", "Unit", L, U, &work[0], stat, info);

	    /* Multiply by inv(U). */
	    sp_ztrsv("U", "No trans", "Non-unit", L, U, &work[0], stat, info);
	    
	} else {

	    /* Multiply by inv(U'). */
	    sp_ztrsv("U", "Transpose", "Non-unit", L, U, &work[0], stat, info);

	    /* Multiply by inv(L'). */
	    sp_ztrsv("L", "Transpose", "Unit", L, U, &work[0], stat, info);
	    
	}

    } while ( kase != 0 );

    /* Compute the estimate of the reciprocal condition number. */
    if (ainvnm != 0.) *rcond = (1. / ainvnm) / anorm;

    SUPERLU_FREE (work);
    return;

}